

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakDetectorTest_periodDisabled_Test::TEST_MemoryLeakDetectorTest_periodDisabled_Test
          (TEST_MemoryLeakDetectorTest_periodDisabled_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).reporter =
       (MemoryLeakFailureForTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator =
       (AllocatorForMemoryLeakDetectionTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector = (MemoryLeakDetector *)0x0;
  TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest::TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest
            (&this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_0035eac0;
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, periodDisabled)
{
    detector->disable();
    char* mem = detector->allocMemory(defaultMallocAllocator(), 2);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all));
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_disabled));
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_enabled));
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_checking));
    detector->deallocMemory(defaultMallocAllocator(), mem);
}